

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix<Complex> Matrix<Complex>::fromRow(string *s)

{
  bool bVar1;
  istream *piVar2;
  Complex *pCVar3;
  Complex *extraout_RDX;
  undefined8 in_RDI;
  Matrix<Complex> MVar4;
  uint i;
  vector<Complex,_std::allocator<Complex>_> v;
  Complex f;
  istringstream iss;
  Matrix<Complex> *m;
  Complex *in_stack_fffffffffffffd68;
  reference in_stack_fffffffffffffd70;
  value_type *in_stack_fffffffffffffd78;
  Complex *in_stack_fffffffffffffd80;
  MatrixRow<Complex_&> local_250;
  uint in_stack_fffffffffffffdb8;
  uint in_stack_fffffffffffffdbc;
  uint c;
  uint in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  vector<Complex,_std::allocator<Complex>_> local_238 [4];
  Complex *in_stack_fffffffffffffe28;
  istream *in_stack_fffffffffffffe30;
  istringstream local_190 [400];
  
  std::__cxx11::istringstream::istringstream(local_190);
  std::__cxx11::istringstream::str((string *)local_190);
  Complex::Complex(in_stack_fffffffffffffd80);
  std::vector<Complex,_std::allocator<Complex>_>::vector
            ((vector<Complex,_std::allocator<Complex>_> *)0x167f20);
  while( true ) {
    piVar2 = operator>>(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::vector<Complex,_std::allocator<Complex>_>::push_back
              ((vector<Complex,_std::allocator<Complex>_> *)in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78);
  }
  bVar1 = std::vector<Complex,_std::allocator<Complex>_>::empty
                    ((vector<Complex,_std::allocator<Complex>_> *)in_stack_fffffffffffffd80);
  if (bVar1) {
    Matrix((Matrix<Complex> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
           in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
  }
  else {
    in_stack_fffffffffffffdc0 = in_stack_fffffffffffffdc0 & 0xffffff;
    std::vector<Complex,_std::allocator<Complex>_>::size(local_238);
    Matrix((Matrix<Complex> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
           in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
    c = 0;
    while( true ) {
      in_stack_fffffffffffffd80 = (Complex *)(ulong)c;
      pCVar3 = (Complex *)std::vector<Complex,_std::allocator<Complex>_>::size(local_238);
      if (pCVar3 <= in_stack_fffffffffffffd80) break;
      in_stack_fffffffffffffd70 =
           std::vector<Complex,_std::allocator<Complex>_>::operator[](local_238,(ulong)c);
      local_250.arr = (Complex *)operator[](in_stack_fffffffffffffd68,0);
      in_stack_fffffffffffffd68 = MatrixRow<Complex_&>::operator[](&local_250,c);
      Complex::operator=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      c = c + 1;
    }
  }
  std::vector<Complex,_std::allocator<Complex>_>::~vector
            ((vector<Complex,_std::allocator<Complex>_> *)in_stack_fffffffffffffd80);
  Complex::~Complex(in_stack_fffffffffffffd70);
  std::__cxx11::istringstream::~istringstream(local_190);
  MVar4.arr = extraout_RDX;
  MVar4._0_8_ = in_RDI;
  return MVar4;
}

Assistant:

const Matrix<Field> Matrix<Field>::fromRow(const std::string &s)
{
    std::istringstream iss;
    iss.str(s);
    Field f;
    std::vector<Field> v;
    while(iss >> f)
        v.push_back(f);
    if(v.empty())
        return Matrix(1, 1);
    Matrix m(1, v.size());
    for(unsigned i = 0; i < v.size(); ++i)
        m[0][i] = v[i];
    return m;
}